

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseObject<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericInsituStringStream<rapidjson::UTF8<char>_> *is,VWReaderHandler<true> *handler)

{
  int iVar1;
  undefined4 extraout_var;
  byte *pbVar2;
  _func_int **pp_Var3;
  long lVar4;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  BaseState<true> *pBVar8;
  undefined4 extraout_var_00;
  
  is->src_ = is->src_ + 1;
  pBVar8 = (handler->ctx).current_state;
  iVar1 = (*pBVar8->_vptr_BaseState[5])(pBVar8,handler);
  if ((BaseState<true> *)CONCAT44(extraout_var,iVar1) != (BaseState<true> *)0x0) {
    (handler->ctx).previous_state = (handler->ctx).current_state;
    (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var,iVar1);
    pbVar2 = (byte *)is->src_;
    while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
      pbVar2 = pbVar2 + 1;
    }
    is->src_ = (Ch *)pbVar2;
    if (*(int *)(this + 0x30) != 0) {
      return;
    }
    if (*pbVar2 != 0x7d) {
      if (*pbVar2 == 0x22) {
        uVar7 = 0;
        do {
          ParseString<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar2 = (byte *)is->src_;
          pbVar5 = pbVar2;
          while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
            pbVar2 = pbVar2 + 1;
            pbVar5 = pbVar5 + 1;
          }
          is->src_ = (Ch *)pbVar2;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          if (*pbVar2 != 0x3a) {
            lVar4 = (long)pbVar5 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
LAB_001147c9:
            *(long *)(this + 0x38) = lVar4;
            return;
          }
          pbVar2 = pbVar2 + 1;
          is->src_ = (Ch *)pbVar2;
          while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
            pbVar2 = pbVar2 + 1;
          }
          is->src_ = (Ch *)pbVar2;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<1u,rapidjson::GenericInsituStringStream<rapidjson::UTF8<char>>,VWReaderHandler<true>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pbVar2 = (byte *)is->src_;
          pbVar5 = pbVar2;
          while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
            pbVar2 = pbVar2 + 1;
            pbVar5 = pbVar5 + 1;
          }
          is->src_ = (Ch *)pbVar2;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          uVar7 = uVar7 + 1;
          if (*pbVar2 != 0x2c) {
            if (*pbVar2 != 0x7d) {
              lVar4 = (long)pbVar5 - (long)is->head_;
              *(undefined4 *)(this + 0x30) = 6;
              goto LAB_001147c9;
            }
            is->src_ = (Ch *)(pbVar2 + 1);
            pBVar8 = (handler->ctx).current_state;
            pp_Var3 = pBVar8->_vptr_BaseState;
            uVar6 = (ulong)uVar7;
            goto LAB_00114663;
          }
          pbVar2 = pbVar2 + 1;
          is->src_ = (Ch *)pbVar2;
          while (((ulong)*pbVar2 < 0x21 && ((0x100002600U >> ((ulong)*pbVar2 & 0x3f) & 1) != 0))) {
            pbVar2 = pbVar2 + 1;
          }
          is->src_ = (Ch *)pbVar2;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        } while (*pbVar2 == 0x22);
      }
      lVar4 = (long)pbVar2 - (long)is->head_;
      *(undefined4 *)(this + 0x30) = 4;
      goto LAB_00114687;
    }
    is->src_ = (Ch *)(pbVar2 + 1);
    pBVar8 = (handler->ctx).current_state;
    pp_Var3 = pBVar8->_vptr_BaseState;
    uVar6 = 0;
LAB_00114663:
    iVar1 = (*pp_Var3[7])(pBVar8,handler,uVar6);
    if ((BaseState<true> *)CONCAT44(extraout_var_00,iVar1) != (BaseState<true> *)0x0) {
      (handler->ctx).previous_state = (handler->ctx).current_state;
      (handler->ctx).current_state = (BaseState<true> *)CONCAT44(extraout_var_00,iVar1);
      return;
    }
  }
  lVar4 = (long)is->src_ - (long)is->head_;
  *(undefined4 *)(this + 0x30) = 0x10;
LAB_00114687:
  *(long *)(this + 0x38) = lVar4;
  return;
}

Assistant:

void ParseObject(InputStream& is, Handler& handler)
  { RAPIDJSON_ASSERT(is.Peek() == '{');
    is.Take();  // Skip '{'

    if (RAPIDJSON_UNLIKELY(!handler.StartObject()))
      RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());

    SkipWhitespaceAndComments<parseFlags>(is);
    RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

    if (Consume(is, '}'))
    { if (RAPIDJSON_UNLIKELY(!handler.EndObject(0)))  // empty object
        RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
      return;
    }

    for (SizeType memberCount = 0;;)
    { if (RAPIDJSON_UNLIKELY(is.Peek() != '"'))
        RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissName, is.Tell());

      ParseString<parseFlags>(is, handler, true);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      if (RAPIDJSON_UNLIKELY(!Consume(is, ':')))
        RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissColon, is.Tell());

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      ParseValue<parseFlags>(is, handler);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      SkipWhitespaceAndComments<parseFlags>(is);
      RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;

      ++memberCount;

      switch (is.Peek())
      { case ',':
          is.Take();
          SkipWhitespaceAndComments<parseFlags>(is);
          RAPIDJSON_PARSE_ERROR_EARLY_RETURN_VOID;
          break;
        case '}':
          is.Take();
          if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
          return;
        default:
          RAPIDJSON_PARSE_ERROR(kParseErrorObjectMissCommaOrCurlyBracket, is.Tell()); break; // This useless break is only for making warning and coverage happy
      }

      if (parseFlags & kParseTrailingCommasFlag)
      { if (is.Peek() == '}')
        { if (RAPIDJSON_UNLIKELY(!handler.EndObject(memberCount)))
            RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
          is.Take();
          return;
        }
      }
    }
  }